

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

LONG __thiscall CorUnix::CSynchData::Release(CSynchData *this,CPalThread *pthrCurrent)

{
  LONG *pLVar1;
  int iVar2;
  ObjectDomain OVar3;
  long lVar4;
  uint uVar5;
  
  LOCK();
  pLVar1 = &this->m_lRefCount;
  iVar2 = *pLVar1;
  *pLVar1 = *pLVar1 + -1;
  UNLOCK();
  uVar5 = iVar2 - 1;
  if ((int)uVar5 < 0) {
    fprintf(_stderr,"] %s %s:%d","Release",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x300);
    fprintf(_stderr,
            "Expression: 0 <= lCount, Description: CSynchData %p with negative reference count [%d]\n"
            ,this,(ulong)uVar5);
  }
  lVar4 = CPalSynchronizationManager::s_pObjSynchMgr;
  if (uVar5 == 0) {
    OVar3 = this->m_odObjectDomain;
    if (((OVar3 != SharedObject) || ((this->m_ptrWTLHead).shrid != 0)) &&
       ((OVar3 == SharedObject || ((this->m_ptrWTLHead).shrid != 0)))) {
      fprintf(_stderr,"] %s %s:%d","Release",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x30b);
      fprintf(_stderr,
              "Expression: (fSharedObject && (NULLSharedID == m_ptrWTLHead.shrid)) || (!fSharedObject && (NULL == m_ptrWTLHead.ptr)), Description: Final Release on CSynchData with threads still in the waiting list\n"
             );
    }
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    if (OVar3 == SharedObject) {
      CSHRSynchCache<CorUnix::CSynchData>::Add
                ((CSHRSynchCache<CorUnix::CSynchData> *)(lVar4 + 0x238),pthrCurrent,
                 this->m_shridThis);
    }
    else {
      CSynchCache<CorUnix::CSynchData>::Add
                ((CSynchCache<CorUnix::CSynchData> *)(lVar4 + 400),pthrCurrent,this);
    }
  }
  return uVar5;
}

Assistant:

LONG CSynchData::Release(CPalThread * pthrCurrent)
    {
        VALIDATEOBJECT(this);
        
        LONG lCount = InterlockedDecrement(&m_lRefCount);

        _ASSERT_MSG(0 <= lCount,
                    "CSynchData %p with negative reference count [%d]\n", 
                    this, lCount);

        if (0 == lCount)
        {
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            bool fSharedObject = (SharedObject == m_odObjectDomain);

            _ASSERT_MSG((fSharedObject && (NULLSharedID == m_ptrWTLHead.shrid)) ||
                        (!fSharedObject && (NULL == m_ptrWTLHead.ptr)),
                        "Final Release on CSynchData with threads still in "
                        "the waiting list\n"); 

            TRACE("Disposing %s waitable object with SynchData @ "
                  "{shrid=%p, p=%p}\n",
                  (SharedObject == m_odObjectDomain) ? "shared" : "local",
                  (PVOID)m_shridThis, this);
            

#ifdef SYNCH_STATISTICS
            LONG lStatWaitCount = GetStatWaitCount();
            LONG lStatContentionCount = GetStatContentionCount();
            LONG lCount, lNewCount;

            TRACE("Statistical data for SynchData of otiType=%u @ %p: WaitCount=%d "
                  "ContentionCount=%d\n", m_otiObjectTypeId, this, lStatWaitCount, 
                  lStatContentionCount);
            
            do {
                lCount = g_rglStatWaitCount[m_otiObjectTypeId];
                lNewCount = lCount + lStatWaitCount;
                lNewCount = InterlockedCompareExchange(&(g_rglStatWaitCount[m_otiObjectTypeId]), 
                                                       lNewCount, lCount);
            } while (lCount != lNewCount);

            lStatWaitCount = lNewCount;

            do {
                lCount = g_rglStatContentionCount[m_otiObjectTypeId];
                lNewCount = lCount + lStatContentionCount;
                lNewCount = InterlockedCompareExchange(&(g_rglStatContentionCount[m_otiObjectTypeId]), 
                                                       lNewCount, lCount);
            } while (lCount != lNewCount);

            lStatContentionCount = lNewCount;

            TRACE("Total current statistical data for otiType=%u objects: WaitCount=%d "
                  "ContentionCount=%d\n", m_otiObjectTypeId, lStatWaitCount, 
                  lStatContentionCount);
#endif // SYNCH_STATISTICS       

            if (fSharedObject)
            {
                pSynchManager->CacheAddSharedSynchData(pthrCurrent, m_shridThis);
            }
            else
            {
                pSynchManager->CacheAddLocalSynchData(pthrCurrent, this);
            }            
        }
            
        return lCount;
    }